

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JSON.cc
# Opt level: O0

bool __thiscall phosg::JSON::empty(JSON *this)

{
  char *pcVar1;
  variant_alternative_t<5UL,_variant<std::nullptr_t,_bool,_long,_double,_basic_string<char,_char_traits<char>,_allocator<char>_>,_vector<unique_ptr<JSON,_default_delete<JSON>_>,_allocator<unique_ptr<JSON,_default_delete<JSON>_>_>_>,_unordered_map<basic_string<char,_char_traits<char>,_allocator<char>_>,_unique_ptr<JSON,_default_delete<JSON>_>,_hash<string>,_equal_to<basic_string<char,_char_traits<char>,_allocator<char>_>_>,_allocator<pair<const_basic_string<char,_char_traits<char>,_allocator<char>_>,_unique_ptr<JSON,_default_delete<JSON>_>_>_>_>_>_>
  *this_00;
  variant_alternative_t<6UL,_variant<std::nullptr_t,_bool,_long,_double,_basic_string<char,_char_traits<char>,_allocator<char>_>,_vector<unique_ptr<JSON,_default_delete<JSON>_>,_allocator<unique_ptr<JSON,_default_delete<JSON>_>_>_>,_unordered_map<basic_string<char,_char_traits<char>,_allocator<char>_>,_unique_ptr<JSON,_default_delete<JSON>_>,_hash<string>,_equal_to<basic_string<char,_char_traits<char>,_allocator<char>_>_>,_allocator<pair<const_basic_string<char,_char_traits<char>,_allocator<char>_>,_unique_ptr<JSON,_default_delete<JSON>_>_>_>_>_>_>
  *this_01;
  type_error *this_02;
  int in_EDX;
  char *in_RSI;
  allocator<char> local_39;
  string local_38;
  JSON *local_18;
  JSON *this_local;
  
  local_18 = this;
  pcVar1 = ::std::
           variant<std::nullptr_t,_bool,_long,_double,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::unique_ptr<phosg::JSON,_std::default_delete<phosg::JSON>_>,_std::allocator<std::unique_ptr<phosg::JSON,_std::default_delete<phosg::JSON>_>_>_>,_std::unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<phosg::JSON,_std::default_delete<phosg::JSON>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<phosg::JSON,_std::default_delete<phosg::JSON>_>_>_>_>_>
           ::index(&this->value,in_RSI,in_EDX);
  if (pcVar1 == (char *)0x5) {
    this_00 = ::std::
              get<5ul,decltype(nullptr),bool,long,double,std::__cxx11::string,std::vector<std::unique_ptr<phosg::JSON,std::default_delete<phosg::JSON>>,std::allocator<std::unique_ptr<phosg::JSON,std::default_delete<phosg::JSON>>>>,std::unordered_map<std::__cxx11::string,std::unique_ptr<phosg::JSON,std::default_delete<phosg::JSON>>,std::hash<std::__cxx11::string>,std::equal_to<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::unique_ptr<phosg::JSON,std::default_delete<phosg::JSON>>>>>>
                        (&this->value);
    this_local._7_1_ =
         ::std::
         vector<std::unique_ptr<phosg::JSON,_std::default_delete<phosg::JSON>_>,_std::allocator<std::unique_ptr<phosg::JSON,_std::default_delete<phosg::JSON>_>_>_>
         ::empty(this_00);
  }
  else {
    if (pcVar1 != (char *)0x6) {
      this_02 = (type_error *)__cxa_allocate_exception(0x10);
      ::std::allocator<char>::allocator();
      ::std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_38,"cannot get empty property of primitive JSON value",&local_39);
      type_error::type_error(this_02,&local_38);
      __cxa_throw(this_02,&type_error::typeinfo,type_error::~type_error);
    }
    this_01 = ::std::
              get<6ul,decltype(nullptr),bool,long,double,std::__cxx11::string,std::vector<std::unique_ptr<phosg::JSON,std::default_delete<phosg::JSON>>,std::allocator<std::unique_ptr<phosg::JSON,std::default_delete<phosg::JSON>>>>,std::unordered_map<std::__cxx11::string,std::unique_ptr<phosg::JSON,std::default_delete<phosg::JSON>>,std::hash<std::__cxx11::string>,std::equal_to<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::unique_ptr<phosg::JSON,std::default_delete<phosg::JSON>>>>>>
                        (&this->value);
    this_local._7_1_ =
         ::std::
         unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<phosg::JSON,_std::default_delete<phosg::JSON>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<phosg::JSON,_std::default_delete<phosg::JSON>_>_>_>_>
         ::empty(this_01);
  }
  return this_local._7_1_;
}

Assistant:

bool JSON::empty() const {
  switch (this->value.index()) {
    case 5:
      return ::get<5>(this->value).empty();
    case 6:
      return ::get<6>(this->value).empty();
    default:
      throw type_error("cannot get empty property of primitive JSON value");
  }
}